

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

int __thiscall JetHead::Path::remove(Path *this,char *__filename)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  undefined4 local_1c;
  int res;
  Path *this_local;
  
  bVar1 = isDir(this);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_1c = rmdir(pcVar2);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_1c = unlink(pcVar2);
  }
  if (local_1c == 0) {
    this_local._4_4_ = kNoError;
  }
  else {
    piVar3 = __errno_location();
    this_local._4_4_ = getErrorCode(*piVar3);
  }
  return this_local._4_4_;
}

Assistant:

ErrCode Path::remove()
{
	int res = 0;
	if ( isDir() )
	{
		LOG_NOISE( "Removing Dir" );
		res = ::rmdir( mPath.c_str() );
	}
	else
	{
		LOG_NOISE( "Removing File" );
		res = ::unlink( mPath.c_str() );
	}
	
	if ( res != 0 )
	{
		return getErrorCode( errno );
	}
	
	return kNoError;
}